

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O3

TestCaseGroup * vkt::image::createImageMultisampleLoadStoreTests(TestContext *testCtx)

{
  VkFormat VVar1;
  int samples;
  TestContext *testCtx_00;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  bool bVar5;
  TestNode *this;
  TestNode *this_00;
  long *plVar6;
  TestNode *this_01;
  TestNode *node;
  long *plVar7;
  ImageType imageType;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  string formatGroupName;
  string samplesCaseName;
  CaseDef caseDef;
  Texture textures [2];
  Texture *local_298;
  long *local_290 [2];
  long local_280 [2];
  int local_26c;
  undefined8 local_268;
  undefined1 local_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  TestContext *local_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  undefined8 local_210;
  undefined4 local_208;
  pointer local_200;
  undefined4 local_1f8;
  long local_1f0;
  long local_1e8;
  string local_1e0;
  undefined1 local_1c0;
  ios_base local_170 [264];
  Texture local_68;
  Texture local_50;
  
  local_1e0._M_dataplus._M_p = (pointer)0x2000000020;
  local_1e0._M_string_length._0_4_ = 1;
  local_298 = &local_68;
  Texture::Texture(local_298,IMAGE_TYPE_2D,(IVec3 *)&local_1e0,1,1);
  local_258 = (long *)0x2000000020;
  local_250 = CONCAT44(local_250._4_4_,1);
  Texture::Texture(&local_50,IMAGE_TYPE_2D_ARRAY,(IVec3 *)&local_258,4,1);
  this = (TestNode *)operator_new(0x70);
  local_238 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"load_store_multisample",
             "Multisampled image store and load");
  bVar2 = true;
  do {
    bVar5 = bVar2;
    this_00 = (TestNode *)operator_new(0x70);
    getImageTypeName_abi_cxx11_(&local_1e0,(image *)(ulong)local_298->m_type,imageType);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,local_238,local_1e0._M_dataplus._M_p,"");
    uVar8 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                               local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
      uVar8 = extraout_RDX_00;
    }
    local_26c = local_298->m_numLayers;
    lVar9 = 0;
    do {
      VVar1 = createImageMultisampleLoadStoreTests::formats[lVar9];
      bVar3 = 1;
      uVar4 = 0;
      local_1f0 = lVar9;
      do {
        getFormatShortString_abi_cxx11_(&local_1e0,(image *)(ulong)VVar1,(VkFormat)uVar8);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        local_258 = &local_248;
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_248 = *plVar7;
          lStack_240 = plVar6[3];
        }
        else {
          local_248 = *plVar7;
          local_258 = (long *)*plVar6;
        }
        local_250 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,
                          CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                                   local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
        }
        this_01 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_01,local_238,(char *)local_258,"");
        lVar10 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e0);
          samples = *(int *)((long)createImageMultisampleLoadStoreTests::samples + lVar10);
          std::ostream::operator<<(&local_1e0,samples);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e0);
          std::ios_base::~ios_base(local_170);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_290,0,(char *)0x0,0xab5dc3);
          local_230 = &local_220;
          plVar7 = plVar6 + 2;
          if ((long *)*plVar6 == plVar7) {
            local_220 = *plVar7;
            lStack_218 = plVar6[3];
          }
          else {
            local_220 = *plVar7;
            local_230 = (long *)*plVar6;
          }
          local_228 = plVar6[1];
          *plVar6 = (long)plVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if (local_290[0] != local_280) {
            operator_delete(local_290[0],local_280[0] + 1);
          }
          Texture::Texture((Texture *)&local_1e0,local_298,samples);
          local_290[0] = local_280;
          local_1e0.field_2._8_4_ = VVar1;
          local_1e0.field_2._12_4_ = samples;
          local_1c0 = uVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"");
          plVar7 = local_230;
          plVar6 = local_290[0];
          local_1f8 = (undefined4)local_1e0._M_string_length;
          local_200 = local_1e0._M_dataplus._M_p;
          local_208 = local_1e0.field_2._M_allocated_capacity._4_4_;
          local_210 = CONCAT44(local_1e0.field_2._M_allocated_capacity._0_4_,
                               local_1e0._M_string_length._4_4_);
          local_260 = local_1c0;
          local_268 = CONCAT44(local_1e0.field_2._12_4_,local_1e0.field_2._8_4_);
          testCtx_00 = this_01->m_testCtx;
          local_1e8 = lVar10;
          node = (TestNode *)operator_new(0xa8);
          tcu::TestCase::TestCase
                    ((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)plVar7,
                     (char *)plVar6);
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cfe690;
          node[1]._vptr_TestNode = (_func_int **)anon_unknown_1::initPrograms;
          node[1].m_testCtx = (TestContext *)anon_unknown_1::test;
          *(undefined4 *)&node[1].m_name._M_string_length = local_1f8;
          node[1].m_name._M_dataplus._M_p = local_200;
          *(undefined8 *)((long)&node[1].m_name._M_string_length + 4) = local_210;
          *(undefined4 *)((long)&node[1].m_name.field_2 + 4) = local_208;
          *(undefined8 *)((long)&node[1].m_name.field_2 + 8) = local_268;
          *(undefined1 *)&node[1].m_description._M_dataplus._M_p = local_260;
          tcu::TestNode::addChild(this_01,node);
          if (local_290[0] != local_280) {
            operator_delete(local_290[0],local_280[0] + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,local_220 + 1);
          }
          lVar9 = local_1f0;
          lVar10 = local_1e8 + 4;
        } while (lVar10 != 0x18);
        tcu::TestNode::addChild(this_00,this_01);
        uVar8 = extraout_RDX_01;
        if (local_258 != &local_248) {
          operator_delete(local_258,local_248 + 1);
          uVar8 = extraout_RDX_02;
        }
        uVar4 = 1;
        bVar2 = (bool)(bVar3 & local_26c != 1);
        bVar3 = 0;
      } while (bVar2);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xd);
    tcu::TestNode::addChild(this,this_00);
    local_298 = &local_50;
    bVar2 = false;
  } while (bVar5);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createImageMultisampleLoadStoreTests (tcu::TestContext& testCtx)
{
	const Texture textures[] =
	{
		// \note Shader code is tweaked to work with image size of 32, take a look if this needs to be modified.
		Texture(IMAGE_TYPE_2D,			tcu::IVec3(32,	32,	1),		1),
		Texture(IMAGE_TYPE_2D_ARRAY,	tcu::IVec3(32,	32,	1),		4),
	};

	static const VkFormat formats[] =
	{
		VK_FORMAT_R32G32B32A32_SFLOAT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R32_SFLOAT,

		VK_FORMAT_R32G32B32A32_UINT,
		VK_FORMAT_R16G16B16A16_UINT,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R32_UINT,

		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R16G16B16A16_SINT,
		VK_FORMAT_R8G8B8A8_SINT,
		VK_FORMAT_R32_SINT,

		VK_FORMAT_R8G8B8A8_UNORM,

		VK_FORMAT_R8G8B8A8_SNORM,
	};

	static const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT,
	};

	MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "load_store_multisample", "Multisampled image store and load"));

	for (int baseTextureNdx = 0; baseTextureNdx < DE_LENGTH_OF_ARRAY(textures); ++baseTextureNdx)
	{
		const Texture&				baseTexture			= textures[baseTextureNdx];
		MovePtr<tcu::TestCaseGroup>	imageViewGroup		(new tcu::TestCaseGroup(testCtx, getImageTypeName(baseTexture.type()).c_str(), ""));
		const int					numLayerBindModes	= (baseTexture.numLayers() == 1 ? 1 : 2);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
		for (int layerBindMode = 0; layerBindMode < numLayerBindModes; ++layerBindMode)
		{
			const bool					singleLayerBind	= (layerBindMode != 0);
			const std::string			formatGroupName	= getFormatShortString(formats[formatNdx]) + (singleLayerBind ? "_single_layer" : "");
			MovePtr<tcu::TestCaseGroup>	formatGroup		(new tcu::TestCaseGroup(testCtx, formatGroupName.c_str(), ""));

			for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); ++samplesNdx)
			{
				const std::string	samplesCaseName = "samples_" + de::toString(samples[samplesNdx]);

				const CaseDef		caseDef =
				{
					Texture(baseTexture, samples[samplesNdx]),
					formats[formatNdx],
					samples[samplesNdx],
					singleLayerBind,
				};

				addFunctionCaseWithPrograms(formatGroup.get(), samplesCaseName, "", initPrograms, test, caseDef);
			}
			imageViewGroup->addChild(formatGroup.release());
		}
		testGroup->addChild(imageViewGroup.release());
	}

	return testGroup.release();
}